

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipc_messages.cpp
# Opt level: O3

int test_ipcmsg_summary_with_testres(ITesting *t)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _func_int **pp_Var4;
  undefined8 uVar5;
  bool bVar6;
  kTRContinueMode kVar7;
  int iVar8;
  IPCTestResults *this_00;
  char *pcVar9;
  IPCTestResults *testResultsOut;
  IPCResultSummary resultSummaryIn;
  Ref tr;
  UTest_IPC_VectorWriter vectorWriter;
  AssertError assertError;
  IPCBufferedWriter bufferedWriter;
  IPCBinaryDecoder decoder;
  IPCBinaryEncoder encoder;
  UTest_IPC_VectorReader vectorReader;
  IPCTestResults *local_1a8;
  undefined1 local_1a0 [32];
  pointer local_180;
  iterator iStack_178;
  IPCTestResults **local_170;
  string local_168;
  long *local_148;
  long lStack_140;
  long local_138;
  _func_int **local_130;
  undefined1 local_128 [48];
  undefined1 local_f8 [16];
  pointer pAStack_e8;
  pointer local_e0;
  string local_d8;
  string local_b8;
  IPCBufferedWriter local_98;
  IPCBinaryDecoder local_70;
  undefined **local_58;
  IPCBufferedWriter *local_50;
  IPCReader local_48;
  undefined8 local_40;
  undefined1 *local_38;
  
  local_1a0._0_8_ = &PTR__IPCResultSummary_0021f120;
  local_1a0._8_8_ = &PTR__IPCResultSummary_0021f158;
  local_180 = (pointer)0x0;
  iStack_178._M_current = (IPCTestResults **)0x0;
  local_170 = (IPCTestResults **)0x0;
  local_1a0._16_4_ = 1;
  local_1a0._20_4_ = 2;
  local_1a0._24_8_ = 3.0;
  local_f8._0_8_ = &PTR__AssertError_0021e770;
  local_f8._8_8_ = (pointer)0x0;
  pAStack_e8 = (pointer)0x0;
  local_e0 = (pointer)0x0;
  local_130 = (_func_int **)&PTR__AssertError_0021e770;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"your hamster is a cat","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"my_fine_file.cpp","");
  trun::AssertError::Add((AssertError *)local_f8,kAssert_Error,0x1267,&local_b8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"my_test_case","");
  trun::TestResult::Create((TestResult *)local_128,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  *(kTestResult *)(local_128._0_8_ + 0x41) = kTestResult_Pass;
  trun::TestResult::SetAssertError((TestResult *)local_128._0_8_,(AssertError *)local_f8);
  *(int *)(local_128._0_8_ + 0x54) = 1;
  this_00 = (IPCTestResults *)operator_new(0x60);
  gnilk::IPCTestResults::IPCTestResults(this_00,(Ref *)local_128);
  local_1a8 = this_00;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this_00->symbolName,0,(this_00->symbolName)._M_string_length,"my_test_case",0xc);
  if (iStack_178._M_current == local_170) {
    std::vector<gnilk::IPCTestResults*,std::allocator<gnilk::IPCTestResults*>>::
    _M_realloc_insert<gnilk::IPCTestResults*const&>
              ((vector<gnilk::IPCTestResults*,std::allocator<gnilk::IPCTestResults*>> *)&local_180,
               iStack_178,&local_1a8);
  }
  else {
    *iStack_178._M_current = local_1a8;
    iStack_178._M_current = iStack_178._M_current + 1;
  }
  local_128._16_8_ = &PTR_Write_0021e8d8;
  local_128._24_8_ = (pointer)0x0;
  local_128._32_8_ = (pointer)0x0;
  local_128._40_8_ = 0;
  gnilk::IPCBufferedWriter::IPCBufferedWriter(&local_98,(IPCWriter *)(local_128 + 0x10));
  local_58 = &PTR_Write_0021eef8;
  local_50 = &local_98;
  bVar6 = gnilk::IPCResultSummary::Marshal
                    ((IPCResultSummary *)local_1a0,(IPCEncoderBase *)&local_58);
  if (((!bVar6) &&
      (kVar7 = (*t->AssertError)(0x73,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                 ,"resultSummaryOut.Marshal(encoder)"), kVar7 == kTRLeave)) ||
     ((gnilk::IPCBufferedWriter::Flush(&local_98), local_128._24_8_ == local_128._32_8_ &&
      (kVar7 = (*t->AssertError)(0x77,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                 ,"!vectorWriter.Data().empty()"), kVar7 == kTRLeave)))) {
    iVar8 = 0x10;
    goto LAB_00167207;
  }
  local_38 = local_128 + 0x18;
  local_70.reader = &local_48;
  local_48._vptr_IPCReader = (_func_int **)&PTR_Read_0021e928;
  local_40 = 0;
  local_70.deserializer = (IPCDeserializer *)&local_168._M_string_length;
  local_168._M_dataplus._M_p = (pointer)&PTR__IPCResultSummary_0021f120;
  local_168._M_string_length = (size_type)&PTR__IPCResultSummary_0021f158;
  local_168.field_2._M_allocated_capacity = 0;
  local_168.field_2._8_8_ = 0.0;
  local_148 = (long *)0x0;
  lStack_140 = 0;
  local_138 = 0;
  local_70.super_IPCDecoderBase.super_IPCReader._vptr_IPCReader = (IPCReader)&PTR_Read_0021ee28;
  bVar6 = gnilk::IPCBinaryDecoder::Process(&local_70);
  if (((bVar6) ||
      (kVar7 = (*t->AssertError)(0x7f,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                 ,"decoder.Process()"), kVar7 != kTRLeave)) &&
     ((iVar8 = (*(local_70.reader)->_vptr_IPCReader[1])(), (char)iVar8 == '\0' ||
      (kVar7 = (*t->AssertError)(0x80,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                 ,"decoder.Available() == false"), kVar7 != kTRLeave)))) {
    if ((local_168.field_2._M_allocated_capacity._0_4_ != local_1a0._16_4_) &&
       (kVar7 = (*t->AssertError)(0x83,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                  ,"resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted"
                                 ), kVar7 == kTRLeave)) goto LAB_001671d2;
    if ((local_168.field_2._M_allocated_capacity._4_4_ != local_1a0._20_4_) &&
       (kVar7 = (*t->AssertError)(0x84,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                  ,"resultSummaryIn.testsFailed == resultSummaryOut.testsFailed"),
       kVar7 == kTRLeave)) goto LAB_001671d2;
    if (((((double)local_168.field_2._8_8_ != (double)local_1a0._24_8_) ||
         (NAN((double)local_168.field_2._8_8_) || NAN((double)local_1a0._24_8_))) &&
        (kVar7 = (*t->AssertError)(0x85,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                   ,"resultSummaryIn.durationSec == resultSummaryOut.durationSec"),
        kVar7 == kTRLeave)) ||
       ((lStack_140 - (long)local_148 != (long)iStack_178._M_current - (long)local_180 &&
        (kVar7 = (*t->AssertError)(0x86,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                   ,
                                   "resultSummaryIn.testResults.size() == resultSummaryOut.testResults.size()"
                                  ), kVar7 == kTRLeave)))) goto LAB_001671d2;
    lVar1 = *local_148;
    sVar2 = *(size_t *)(lVar1 + 0x18);
    if (((sVar2 != (local_1a8->symbolName)._M_string_length) ||
        ((sVar2 != 0 &&
         (iVar8 = bcmp(*(void **)(lVar1 + 0x10),(local_1a8->symbolName)._M_dataplus._M_p,sVar2),
         iVar8 != 0)))) &&
       (kVar7 = (*t->AssertError)(0x88,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                  ,"first->symbolName == testResultsOut->symbolName"),
       kVar7 == kTRLeave)) goto LAB_001671d2;
    lVar3 = *(long *)(lVar1 + 0x30);
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x38);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
    pcVar9 = *(char **)(lVar3 + 8);
    if (*(long *)(lVar3 + 0x10) - (long)pcVar9 == 0x48) {
LAB_00167304:
      uVar5 = local_f8._8_8_;
      if (((((*(int *)(pcVar9 + 4) != *(int *)(local_f8._8_8_ + 4)) &&
            (kVar7 = (*t->AssertError)(0x8e,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                       ,"assertErrorIn.line == assertErrorRef.line"),
            kVar7 == kTRLeave)) ||
           (((sVar2 = *(size_t *)(pcVar9 + 0x10), sVar2 != *(size_type *)(uVar5 + 0x10) ||
             ((sVar2 != 0 &&
              (iVar8 = bcmp(*(void **)(pcVar9 + 8),(((string *)(uVar5 + 8))->_M_dataplus)._M_p,sVar2
                           ), iVar8 != 0)))) &&
            (kVar7 = (*t->AssertError)(0x8f,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                       ,"assertErrorIn.file == assertErrorRef.file"),
            kVar7 == kTRLeave)))) ||
          (((sVar2 = *(size_t *)(pcVar9 + 0x30), sVar2 != *(size_type *)(uVar5 + 0x30) ||
            ((sVar2 != 0 &&
             (iVar8 = bcmp(*(void **)(pcVar9 + 0x28),(((string *)(uVar5 + 0x28))->_M_dataplus)._M_p,
                           sVar2), iVar8 != 0)))) &&
           (kVar7 = (*t->AssertError)(0x90,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                      ,"assertErrorIn.message == assertErrorRef.message"),
           kVar7 == kTRLeave)))) ||
         ((*pcVar9 != *(char *)uVar5 &&
          (kVar7 = (*t->AssertError)(0x91,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                     ,"assertErrorIn.assertClass == assertErrorRef.assertClass"),
          kVar7 == kTRLeave)))) goto LAB_001673d1;
      iVar8 = 0;
    }
    else {
      kVar7 = (*t->AssertError)(0x8a,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"testResultIn->Asserts() == 1");
      if (kVar7 != kTRLeave) {
        pcVar9 = *(char **)(lVar3 + 8);
        goto LAB_00167304;
      }
LAB_001673d1:
      iVar8 = 0x10;
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  else {
LAB_001671d2:
    iVar8 = 0x10;
  }
  local_168._M_dataplus._M_p = (pointer)&PTR__IPCResultSummary_0021f120;
  local_168._M_string_length = (size_type)&PTR__IPCResultSummary_0021f158;
  if (local_148 != (long *)0x0) {
    operator_delete(local_148,local_138 - (long)local_148);
  }
LAB_00167207:
  local_98.super_IPCWriter._vptr_IPCWriter = (_func_int **)&PTR_Write_0021ede8;
  if (local_98.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_128._16_8_ = &PTR_Write_0021e8d8;
  if ((pointer)local_128._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_128._24_8_,local_128._40_8_ - local_128._24_8_);
  }
  pp_Var4 = local_130;
  if ((pointer)local_128._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
  }
  local_f8._0_8_ = pp_Var4;
  std::
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>::
  ~vector((vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
           *)(local_f8 + 8));
  local_1a0._0_8_ = &PTR__IPCResultSummary_0021f120;
  local_1a0._8_8_ = &PTR__IPCResultSummary_0021f158;
  if (local_180 != (pointer)0x0) {
    operator_delete(local_180,(long)local_170 - (long)local_180);
  }
  return iVar8;
}

Assistant:

DLL_EXPORT int test_ipcmsg_summary_with_testres(ITesting *t) {
    gnilk::IPCResultSummary resultSummaryOut;
    resultSummaryOut.testsExecuted = 1;
    resultSummaryOut.testsFailed = 2;
    resultSummaryOut.durationSec = 3.0;

    // Create a fake assert error
    trun::AssertError assertError;

    assertError.Add(trun::AssertError::kAssert_Error, 4711, "your hamster is a cat", "my_fine_file.cpp");

    auto tr = trun::TestResult::Create("my_test_case");
    tr->SetResult(trun::kTestResult::kTestResult_Pass);
    tr->SetAssertError(assertError);
    tr->SetNumberOfAsserts(1);  // Must be done explicitly..

    auto testResultsOut = new gnilk::IPCTestResults(tr);
    testResultsOut->symbolName = "my_test_case";
    resultSummaryOut.testResults.push_back(testResultsOut);


    UTest_IPC_VectorWriter vectorWriter;
    gnilk::IPCBufferedWriter bufferedWriter(vectorWriter);
    gnilk::IPCBinaryEncoder encoder(bufferedWriter);

    // Serialize
    TR_ASSERT(t, resultSummaryOut.Marshal(encoder));

    // Flush data - this will do the actual writing to the underlying writer
    bufferedWriter.Flush();
    TR_ASSERT(t, !vectorWriter.Data().empty());

    // Deserialize again
    UTest_IPC_VectorReader vectorReader(vectorWriter.Data());
    gnilk::IPCResultSummary resultSummaryIn;
    gnilk::IPCBinaryDecoder decoder(vectorReader, resultSummaryIn);

    // Deserialize
    TR_ASSERT(t, decoder.Process());
    TR_ASSERT(t, decoder.Available() == false);

    // Make sure we have everything
    TR_ASSERT(t, resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted);
    TR_ASSERT(t, resultSummaryIn.testsFailed == resultSummaryOut.testsFailed);
    TR_ASSERT(t, resultSummaryIn.durationSec == resultSummaryOut.durationSec);
    TR_ASSERT(t, resultSummaryIn.testResults.size() == resultSummaryOut.testResults.size());
    auto first = resultSummaryIn.testResults[0];
    TR_ASSERT(t, first->symbolName == testResultsOut->symbolName);
    auto testResultIn = first->testResult;
    TR_ASSERT(t, testResultIn->Asserts() == 1);
    // Verify the propagation of the assert error from above
    auto &assertErrorIn = testResultIn->AssertError().Errors().front();
    auto &assertErrorRef = assertError.Errors().front();
    TR_ASSERT(t, assertErrorIn.line == assertErrorRef.line);
    TR_ASSERT(t, assertErrorIn.file == assertErrorRef.file);
    TR_ASSERT(t, assertErrorIn.message == assertErrorRef.message);
    TR_ASSERT(t, assertErrorIn.assertClass == assertErrorRef.assertClass);


    return kTR_Pass;

}